

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O0

void __thiscall fw::Shader::compile(Shader *this,GLenum shaderType)

{
  PFNGLSHADERSOURCEPROC p_Var1;
  GLuint GVar2;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<const_char_*,_std::allocator<const_char_*>_>_> __result;
  size_type sVar3;
  char **ppcVar4;
  ostream *poVar5;
  GLchar local_268 [8];
  GLchar infoLog [512];
  GLint success;
  GLuint shader;
  undefined1 local_30 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> transformedSources;
  GLenum shaderType_local;
  Shader *this_local;
  
  transformedSources.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = shaderType;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->_sources);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->_sources);
  __result = std::back_inserter<std::vector<char_const*,std::allocator<char_const*>>>
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char_const*,std::allocator<char_const*>>>,char_const*(*)(std::__cxx11::string_const&)>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current,__result,transformStringToCStr);
  GVar2 = (*glad_glCreateShader)
                    (transformedSources.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_);
  p_Var1 = glad_glShaderSource;
  infoLog._508_4_ = GVar2;
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  (*p_Var1)(GVar2,(GLsizei)sVar3,ppcVar4,(GLint *)0x0);
  (*glad_glCompileShader)(infoLog._508_4_);
  (*glad_glGetShaderiv)(infoLog._508_4_,0x8b81,(GLint *)(infoLog + 0x1f8));
  if (infoLog._504_4_ == 0) {
    (*glad_glGetShaderInfoLog)(infoLog._508_4_,0x200,(GLsizei *)0x0,local_268);
    poVar5 = std::operator<<((ostream *)&std::cout,"Error: Shader compilation failed");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,local_268);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->_shaderType =
         transformedSources.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    this->_shaderId = infoLog._508_4_;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  return;
}

Assistant:

void Shader::compile(GLenum shaderType)
{
    vector<const char *> transformedSources;

    transform(
        _sources.begin(),
        _sources.end(),
        back_inserter(transformedSources),
        transformStringToCStr
    );

    GLuint shader = glCreateShader(shaderType);

    glShaderSource(
        shader,
        transformedSources.size(),
        transformedSources.data(),
        nullptr
    );

    glCompileShader(shader);

    GLint success;
    GLchar infoLog[512];
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (!success) {
        glGetShaderInfoLog(shader, 512, nullptr, infoLog);
        std::cout << "Error: Shader compilation failed" << std::endl
            << infoLog << std::endl;
        return; // todo: throw exception
    }

    _shaderType = shaderType;
    _shaderId = shader;
}